

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spcdas.cpp
# Opt level: O3

void disas(byte o,char *s,byte a,byte b,byte c,byte d)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  undefined7 in_register_00000011;
  int iVar7;
  char *__format;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  char t [16];
  char ws [4096];
  int local_1074;
  uint local_1050;
  char local_1048 [16];
  char local_1038 [4104];
  
  if (spc.addr) {
    sprintf(local_1038,"%04x: ",(ulong)spc.pc);
  }
  else {
    local_1038[0] = '\0';
  }
  if (spc.hex != true) goto LAB_00101320;
  if (o == '\0') {
LAB_001012e5:
    iVar7 = o - 3;
    do {
      sVar4 = strlen(local_1038);
      builtin_strncpy(local_1038 + sVar4,"   ",4);
      iVar7 = iVar7 + 1;
    } while (iVar7 != 0);
  }
  else {
    lVar11 = 9;
    do {
      sprintf(local_1048,"%02x ",(ulong)spc.mem[(ulong)spc.pc + lVar11 + -9]);
      strcat(local_1038,local_1048);
      lVar11 = lVar11 + 1;
    } while ((int)lVar11 - (uint)o != 9);
    if (o < 3) goto LAB_001012e5;
  }
  sVar4 = strlen(local_1038);
  (local_1038 + sVar4)[0] = ' ';
  (local_1038 + sVar4)[1] = '\0';
LAB_00101320:
  uVar8 = CONCAT71(in_register_00000011,a) & 0xffffffff;
  sVar4 = strlen(local_1038);
  sVar5 = strlen(s);
  if ((int)sVar5 < 1) {
    uVar10 = (uint)sVar4;
  }
  else {
    uVar3 = (uint)d;
    uVar2 = (uint)c;
    local_1074 = 0;
    iVar7 = 0;
    do {
      iVar12 = (int)sVar4;
      if (s[iVar7] == '*') {
        bVar1 = s[(long)iVar7 + 1];
        if (bVar1 < 0x72) {
          if (bVar1 == 0x62) {
            uVar6 = (ulong)a;
            switch(local_1074) {
            case 0:
              break;
            case 1:
              uVar6 = (ulong)b;
              break;
            case 2:
              uVar6 = (ulong)uVar2;
              break;
            case 3:
              uVar6 = (ulong)uVar3;
              break;
            default:
              goto switchD_0010143c_default;
            }
            uVar8 = (ulong)spc.mem[spc.pc + uVar6];
switchD_0010143c_default:
            uVar6 = uVar8 & 0xff;
            __format = "%02x";
            goto LAB_00101597;
          }
          if (bVar1 == 0x6d) {
            uVar10 = (uint)a;
            switch(local_1074) {
            case 0:
              break;
            case 1:
              uVar10 = (uint)b;
              break;
            case 2:
              uVar10 = uVar2;
              break;
            case 3:
              uVar10 = uVar3;
              break;
            default:
              goto switchD_001013bd_default;
            }
            uVar8 = (ulong)*(ushort *)(spc.mem + (ulong)uVar10 + (ulong)spc.pc);
switchD_001013bd_default:
            local_1074 = local_1074 + 1;
            sprintf(local_1048,"%04x,%d",(ulong)((uint)uVar8 & 0x1fff),uVar8 >> 0xd);
          }
        }
        else {
          if (bVar1 == 0x72) {
            uVar6 = (ulong)a;
            switch(local_1074) {
            case 0:
              break;
            case 1:
              uVar6 = (ulong)b;
              break;
            case 2:
              uVar6 = (ulong)uVar2;
              break;
            case 3:
              uVar6 = (ulong)uVar3;
              break;
            default:
              goto switchD_0010146a_default;
            }
            uVar8 = (ulong)spc.mem[spc.pc + uVar6];
switchD_0010146a_default:
            if (spc.rel != true) goto switchD_0010143c_default;
            local_1050 = (uint)o;
            uVar8 = (ulong)((int)(char)uVar8 + local_1050 + (uint)spc.pc);
          }
          else {
            if (bVar1 != 0x77) goto LAB_0010159e;
            uVar10 = (uint)a;
            switch(local_1074) {
            case 0:
              break;
            case 1:
              uVar10 = (uint)b;
              break;
            case 2:
              uVar10 = uVar2;
              break;
            case 3:
              uVar10 = uVar3;
              break;
            default:
              goto switchD_0010140e_default;
            }
            uVar8 = (ulong)*(ushort *)(spc.mem + (ulong)uVar10 + (ulong)spc.pc);
          }
switchD_0010140e_default:
          uVar6 = uVar8 & 0xffff;
          __format = "%04x";
LAB_00101597:
          local_1074 = local_1074 + 1;
          sprintf(local_1048,__format,uVar6);
        }
LAB_0010159e:
        iVar7 = iVar7 + 1;
        local_1038[iVar12] = '\0';
        strcat(local_1038,local_1048);
        sVar4 = strlen(local_1048);
        iVar9 = (int)sVar4;
      }
      else {
        local_1038[iVar12] = s[iVar7];
        iVar9 = 1;
      }
      uVar10 = iVar9 + iVar12;
      iVar7 = iVar7 + 1;
      sVar5 = strlen(s);
      sVar4 = (size_t)uVar10;
    } while (iVar7 < (int)sVar5);
  }
  local_1038[(int)uVar10] = '\0';
  fprintf((FILE *)wr,"%s\r\n",local_1038);
  spc.pc = spc.pc + o;
  return;
}

Assistant:

void disas(byte o, const char *s, byte a = 0, byte b = 0, byte c = 0, byte d = 0) {
char ws[4096], t[16];
int i, x, pos = 0, z;
uint v;
  if(spc.addr == true) {
    sprintf(ws, "%04x: ", spc.pc);
  } else {
    strcpy(ws, "");
  }
  if(spc.hex == true) {
    for(i=0;i<o;i++) {
      sprintf(t, "%02x ", spc.mem[spc.pc+i]);
      strcat(ws, t);
    }
    for(;i<3;i++) {
      strcat(ws, "   ");
    }
    strcat(ws, " ");
  }
  z=strlen(ws);
  for(i=0;i<(int)strlen(s);i++) {
    if(s[i]=='*') {
      x=s[++i];
      if(x=='b') {
        if     (pos == 0)v=spc.mem[spc.pc+a];
        else if(pos == 1)v=spc.mem[spc.pc+b];
        else if(pos == 2)v=spc.mem[spc.pc+c];
        else if(pos == 3)v=spc.mem[spc.pc+d];
        pos++;
        sprintf(t, "%02x", v&0xff);
      } else if(x=='w') {
        if     (pos == 0)v=spc.mem[spc.pc+a]|(spc.mem[spc.pc+a+1]<<8);
        else if(pos == 1)v=spc.mem[spc.pc+b]|(spc.mem[spc.pc+b+1]<<8);
        else if(pos == 2)v=spc.mem[spc.pc+c]|(spc.mem[spc.pc+c+1]<<8);
        else if(pos == 3)v=spc.mem[spc.pc+d]|(spc.mem[spc.pc+d+1]<<8);
        pos++;
        sprintf(t, "%04x", v&0xffff);
      } else if(x=='m') {
        if     (pos == 0)v=spc.mem[spc.pc+a]|(spc.mem[spc.pc+a+1]<<8);
        else if(pos == 1)v=spc.mem[spc.pc+b]|(spc.mem[spc.pc+b+1]<<8);
        else if(pos == 2)v=spc.mem[spc.pc+c]|(spc.mem[spc.pc+c+1]<<8);
        else if(pos == 3)v=spc.mem[spc.pc+d]|(spc.mem[spc.pc+d+1]<<8);
        pos++;
        sprintf(t, "%04x,%d", v&0x1fff, v>>13);
      } else if(x=='r') {
        if     (pos == 0)v=spc.mem[spc.pc+a];
        else if(pos == 1)v=spc.mem[spc.pc+b];
        else if(pos == 2)v=spc.mem[spc.pc+c];
        else if(pos == 3)v=spc.mem[spc.pc+d];
        pos++;
        if(spc.rel == true) {
          v=(spc.pc+o)+(signed char)v;
          sprintf(t, "%04x", v&0xffff);
        } else {
          sprintf(t, "%02x", v&0xff);
        }
      }
      ws[z]=0;
      strcat(ws, t);
      z+=strlen(t);
    } else {
      ws[z++]=s[i];
    }
  }
  ws[z]=0;
  fprintf(wr, "%s\r\n", ws);

  spc.pc+=o;
}